

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void report_volume_text(pa_sink_info *i)

{
  uint32_t uVar1;
  ostream *poVar2;
  
  if (i->mute != 0) {
    std::operator<<((ostream *)&std::cout,"muted\n");
    return;
  }
  uVar1 = get_max_volume(i);
  poVar2 = std::ostream::_M_insert<double>((double)uVar1 * 100.0 * 1.52587890625e-05);
  std::operator<<(poVar2,"%\n");
  return;
}

Assistant:

void report_volume_text(const pa_sink_info *i) {
    if (i->mute) {
        cout << "muted\n";
    } else {
        // Use volume of the channel with the greatest value
        uint32_t volume = get_max_volume(i);
        cout << 100. * float(volume) / PA_VOLUME_NORM << "%\n";
    }
}